

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::CheckProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_> _Var5;
  ostream *poVar6;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> targets;
  ostringstream e;
  string local_1d8;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> local_1b8;
  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_> *local_1a0;
  undefined1 local_198 [376];
  
  iVar3 = strncmp((prop->_M_dataplus)._M_p,"LINK_INTERFACE_LIBRARIES",0x18);
  if (iVar3 == 0) {
    pcVar4 = GetProperty(this,prop);
    if (pcVar4 != (char *)0x0) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop,pcVar4,context,false);
    }
  }
  iVar3 = strncmp((prop->_M_dataplus)._M_p,"IMPORTED_LINK_INTERFACE_LIBRARIES",0x21);
  if (iVar3 == 0) {
    pcVar4 = GetProperty(this,prop);
    if (pcVar4 != (char *)0x0) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop,pcVar4,context,true);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)prop);
  if (iVar3 == 0) {
    pcVar4 = GetProperty(this,prop);
    if (pcVar4 != (char *)0x0) {
      if (cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys == '\0') {
        iVar3 = __cxa_guard_acquire(&cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)
                                     ::keys);
        if (iVar3 != 0) {
          cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._0_8_ = 0;
          cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._80_8_ = 0;
          cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._160_8_ = 0;
          cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._192_8_ = 0;
          cmsys::RegularExpression::compile
                    ((RegularExpression *)
                     cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,
                     "(^|;)(debug|optimized|general)(;|$)");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,
                       &__dso_handle);
          __cxa_guard_release(&cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys)
          ;
        }
      }
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)
                         cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,pcVar4
                         ,(RegularExpressionMatch *)
                          cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,
                   "Property INTERFACE_LINK_LIBRARIES may not contain link-type keyword \"",0x45);
        if (cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._16_8_ == 0) {
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          local_1d8._M_string_length = 0;
          local_1d8.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d8,
                     cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._16_8_,
                     cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._96_8_);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_198,local_1d8._M_dataplus._M_p,
                            local_1d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,
                   "\".  The INTERFACE_LINK_LIBRARIES property may contain configuration-sensitive generator-expressions which may be used to specify per-configuration rules."
                   ,0x99);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,
                          CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                   local_1d8.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(context,FATAL_ERROR,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,
                          CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                   local_1d8.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
        std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
      }
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)prop);
  if ((iVar3 == 0) &&
     (((this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget == true)) {
    local_1a0 = &this->impl;
    std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::vector
              (&local_1b8,&context->ImportedTargetsOwned);
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<cmTarget**,std::vector<cmTarget*,std::allocator<cmTarget*>>>,__gnu_cxx::__ops::_Iter_equals_val<cmTarget_const*const>>
                      (local_1b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl
                       .super__Vector_impl_data._M_start,
                       local_1b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl
                       .super__Vector_impl_data._M_finish,&local_1a0);
    if (_Var5._M_current ==
        local_1b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Attempt to promote imported target \"",0x24);
      _Var1._M_head_impl =
           (((unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_> *)
            &local_1a0->_M_t)->_M_t).
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                          *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,
                 "\" to global scope (by setting IMPORTED_GLOBAL) which is not built in this directory."
                 ,0x54);
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(context,FATAL_ERROR,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,
                        CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                 local_1d8.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    }
    if (local_1b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void cmTarget::CheckProperty(const std::string& prop,
                             cmMakefile* context) const
{
  // Certain properties need checking.
  if (cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES")) {
    if (const char* value = this->GetProperty(prop)) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop, value, context, false);
    }
  }
  if (cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES")) {
    if (const char* value = this->GetProperty(prop)) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop, value, context, true);
    }
  }
  if (prop == "INTERFACE_LINK_LIBRARIES") {
    if (const char* value = this->GetProperty(prop)) {
      cmTargetCheckINTERFACE_LINK_LIBRARIES(value, context);
    }
  }
  if (prop == "IMPORTED_GLOBAL") {
    if (this->IsImported()) {
      cmTargetCheckIMPORTED_GLOBAL(this, context);
    }
  }
}